

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xr_object.cxx
# Opt level: O0

void __thiscall xray_re::xr_object::load_bones(xr_object *this,xr_reader *r)

{
  f_r_new<xray_re::xr_bone> read;
  f_r_new<xray_re::xr_partition> read_00;
  uint32_t uVar1;
  size_t sVar2;
  ulong n;
  offset_in_xr_bone_to_subr in_stack_ffffffffffffff78;
  xr_reader *this_00;
  undefined8 in_stack_ffffffffffffff80;
  f_r_new<xray_re::xr_partition> local_48;
  code *local_38;
  undefined8 local_30;
  f_r_new<xray_re::xr_bone> local_28;
  xr_reader *local_18;
  xr_reader *r_local;
  xr_object *this_local;
  
  local_38 = xr_bone::load_data;
  local_30 = 0;
  local_18 = r;
  r_local = (xr_reader *)this;
  xr_reader::f_r_new<xray_re::xr_bone>::f_r_new(&local_28,0x2356a0);
  read._8_8_ = in_stack_ffffffffffffff80;
  read.pmf = in_stack_ffffffffffffff78;
  xr_reader::
  r_chunks<std::vector<xray_re::xr_bone*,std::allocator<xray_re::xr_bone*>>,xray_re::xr_reader::f_r_new<xray_re::xr_bone>>
            (r,&this->m_bones,read);
  sVar2 = xr_reader::find_chunk(local_18,0x923);
  if (sVar2 != 0) {
    this_00 = local_18;
    uVar1 = xr_reader::r_u32(local_18);
    n = (ulong)uVar1;
    xr_reader::f_r_new<xray_re::xr_partition>::f_r_new(&local_48,0x236330);
    read_00._8_8_ = n;
    read_00.pmf = (offset_in_xr_partition_to_subr)this_00;
    xr_reader::
    r_seq<std::vector<xray_re::xr_partition*,std::allocator<xray_re::xr_partition*>>,xray_re::xr_reader::f_r_new<xray_re::xr_partition>>
              (this_00,n,&this->m_partitions,read_00);
    xr_reader::debug_find_chunk(local_18);
  }
  return;
}

Assistant:

void xr_object::load_bones(xr_reader& r)
{
	r.r_chunks(m_bones, xr_reader::f_r_new<xr_bone>(&xr_bone::load_data));
	if (r.find_chunk(EOBJ_CHUNK_PARTITIONS_1)) {
		r.r_seq(r.r_u32(), m_partitions, xr_reader::f_r_new<xr_partition>(&xr_partition::load_1));
		r.debug_find_chunk();
	}
}